

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::~IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       pp_Var2;
  *(void **)((long)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
             field_0x60 = vtt[0xd];
  *(void **)&(this->super_IfcGeometricRepresentationContext).field_0xa8 = vtt[0xe];
  pcVar3 = (this->UserDefinedTargetView).ptr._M_dataplus._M_p;
  paVar1 = &(this->UserDefinedTargetView).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->TargetView)._M_dataplus._M_p;
  paVar1 = &(this->TargetView).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       pp_Var2;
  *(void **)((long)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[8];
  *(void **)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
             field_0x60 = vtt[9];
  this_00 = (this->super_IfcGeometricRepresentationContext).WorldCoordinateSystem.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pp_Var2 = (_func_int **)vtt[2];
  (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       pp_Var2;
  *(void **)((long)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[5];
  pcVar3 = (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
           ContextType.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
            ContextType.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x10;
  puVar5 = &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x20;
  if (puVar4 != puVar5) {
    operator_delete(puVar4,*(long *)puVar5 + 1);
    return;
  }
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}